

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_function-c.cpp
# Opt level: O1

void duckdb_destroy_cast_function(duckdb_cast_function *cast_function)

{
  duckdb_cast_function this;
  
  if ((cast_function != (duckdb_cast_function *)0x0) &&
     (this = *cast_function, this != (duckdb_cast_function)0x0)) {
    std::unique_ptr<duckdb::LogicalType,_std::default_delete<duckdb::LogicalType>_>::~unique_ptr
              ((unique_ptr<duckdb::LogicalType,_std::default_delete<duckdb::LogicalType>_> *)
               (this + 8));
    std::unique_ptr<duckdb::LogicalType,_std::default_delete<duckdb::LogicalType>_>::~unique_ptr
              ((unique_ptr<duckdb::LogicalType,_std::default_delete<duckdb::LogicalType>_> *)this);
    operator_delete(this);
    *cast_function = (duckdb_cast_function)0x0;
  }
  return;
}

Assistant:

void duckdb_destroy_cast_function(duckdb_cast_function *cast_function) {
	if (!cast_function || !*cast_function) {
		return;
	}
	const auto function = reinterpret_cast<duckdb::CCastFunction *>(*cast_function);
	delete function;
	*cast_function = nullptr;
}